

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall GdlGlyphDefn::ExplicitPseudos(GdlGlyphDefn *this,PseudoSet *setpglf,bool param_2)

{
  pointer ppGVar1;
  pointer ppGVar2;
  long lVar3;
  GdlGlyphDefn *local_8;
  
  if (*(int *)&(this->super_GdlGlyphClassMember).field_0x34 == 5) {
    ppGVar2 = (setpglf->super__Vector_base<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      if ((long)(setpglf->super__Vector_base<GdlGlyphDefn_*,_std::allocator<GdlGlyphDefn_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3 == lVar3) {
        local_8 = this;
        std::vector<GdlGlyphDefn*,std::allocator<GdlGlyphDefn*>>::emplace_back<GdlGlyphDefn*>
                  ((vector<GdlGlyphDefn*,std::allocator<GdlGlyphDefn*>> *)setpglf,&local_8);
        return;
      }
      ppGVar1 = ppGVar2 + lVar3;
      lVar3 = lVar3 + 1;
    } while (*ppGVar1 != this);
  }
  return;
}

Assistant:

void GdlGlyphDefn::ExplicitPseudos(PseudoSet & setpglf, bool /*fProcessClasses*/)
{
	if (m_glft == kglftPseudo)
	{
		Assert(m_pglfOutput);

		// Old std::set implementation:
		//GdlGlyphDefn * p = this;	// kludge until Set can handle const args.
		//setpglf.insert(p);  

		for (size_t i = 0; i < setpglf.size(); i++) {
			if (setpglf[i] == this)
				return;  // already there
		}
		setpglf.push_back(this);
	}
}